

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O2

char libcalc::symbolType(char symbol)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x16) {
      return '\x03';
    }
    pcVar1 = &TOKEN_SYMBOLS + lVar3;
    lVar3 = lVar3 + 1;
  } while (*pcVar1 != symbol);
  cVar2 = '\x02';
  if (((int)symbol - 0x21U < 0x3e) &&
     ((0x2000000000005791U >> ((ulong)((int)symbol - 0x21U) & 0x3f) & 1) != 0)) {
    cVar2 = '\x01';
  }
  return cVar2;
}

Assistant:

const char symbolType(const char symbol) {
  bool isValid = false;

  for (short i = 0; i < TOKEN_SYMBOLS_LEN; i++) {
    if (TOKEN_SYMBOLS[i] == symbol) {
      isValid = true;
      break;
    }
  }

  if (isValid == false) {
    return TOKEN_TYPE.GARBAGE;
  }

  return isOperator(symbol) ? TOKEN_TYPE.OPERATOR : TOKEN_TYPE.SYMBOL;
}